

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O0

_Bool xdr_dplx_decode(XDR *xdrs,rpc_msg *dmsg)

{
  _Bool _Var1;
  uint32_t uVar2;
  msg_type mVar3;
  uint32_t *puVar4;
  uint32_t *local_28;
  int32_t *buf;
  rpc_msg *dmsg_local;
  XDR *xdrs_local;
  
  puVar4 = (uint32_t *)xdr_inline_decode(xdrs,0x14);
  if (puVar4 == (uint32_t *)0x0) {
    _Var1 = xdr_getuint32(xdrs,&dmsg->rm_xid);
    if (!_Var1) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR rm_xid","xdr_dplx_decode",0x1bd);
      }
      return false;
    }
    _Var1 = xdr_getenum(xdrs,(enum_t *)&dmsg->rm_direction);
    if (!_Var1) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR rm_direction","xdr_dplx_decode",0x1c3);
      }
      return false;
    }
    local_28 = (uint32_t *)0x0;
  }
  else {
    uVar2 = ntohl(*puVar4);
    dmsg->rm_xid = uVar2;
    local_28 = puVar4 + 2;
    mVar3 = ntohl(puVar4[1]);
    dmsg->rm_direction = mVar3;
  }
  if (dmsg->rm_direction == CALL) {
    xdrs_local._7_1_ = xdr_call_decode(xdrs,dmsg,(int32_t *)local_28);
  }
  else if (dmsg->rm_direction == REPLY) {
    xdrs_local._7_1_ = xdr_reply_decode(xdrs,dmsg,(int32_t *)local_28);
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR dmsg->rm_direction (%u)","xdr_dplx_decode",0x1d0,
                 (ulong)dmsg->rm_direction);
    }
    xdrs_local._7_1_ = false;
  }
  return xdrs_local._7_1_;
}

Assistant:

bool
xdr_dplx_decode(XDR *xdrs, struct rpc_msg *dmsg)
{
	int32_t *buf;

	/*
	 * NOTE: 5 here, 3 more in each _decode
	 */
	buf = xdr_inline_decode(xdrs, 5 * BYTES_PER_XDR_UNIT);
	if (buf != NULL) {
		dmsg->rm_xid = IXDR_GET_U_INT32(buf);
		dmsg->rm_direction = IXDR_GET_ENUM(buf, enum msg_type);
	} else {
		if (!xdr_getuint32(xdrs, &(dmsg->rm_xid))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid",
				__func__, __LINE__);
			return (false);
		}
		if (!xdr_getenum(xdrs, (enum_t *)&(dmsg->rm_direction))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction",
				__func__, __LINE__);
			return (false);
		}
	}

	switch (dmsg->rm_direction) {
	case CALL:
		return (xdr_call_decode(xdrs, dmsg, buf));
	case REPLY:
		return (xdr_reply_decode(xdrs, dmsg, buf));
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR dmsg->rm_direction (%u)",
			__func__, __LINE__,
			dmsg->rm_direction);
		break;
	};

	return (false);
}